

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_matrix.cpp
# Opt level: O2

bool __thiscall ON_Matrix::IsRowOrthoNormal(ON_Matrix *this)

{
  uint uVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  double ***pppdVar6;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  
  bVar2 = IsRowOrthoganal(this);
  uVar3 = 0;
  if (bVar2) {
    uVar1 = this->m_row_count;
    pppdVar6 = &this->m;
    if (uVar1 == (this->m_rowmem).m_count) {
      pppdVar6 = &(this->m_rowmem).m_a;
    }
    uVar5 = (ulong)(uint)this->m_col_count;
    if (this->m_col_count < 1) {
      uVar5 = uVar3;
    }
    uVar4 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar4 = uVar3;
    }
    uVar3 = 1;
    for (uVar7 = 0; uVar7 != uVar4; uVar7 = uVar7 + 1) {
      dVar9 = 0.0;
      for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
        dVar9 = dVar9 + (*pppdVar6)[uVar7][uVar8] * (*pppdVar6)[uVar7][uVar8];
      }
      uVar3 = (ulong)((byte)uVar3 & ABS(1.0 - dVar9) < 1.490116119385e-08);
    }
  }
  return SUB81(uVar3,0);
}

Assistant:

bool ON_Matrix::IsRowOrthoNormal() const
{
  double d;
  int i, j;
  bool rc = IsRowOrthoganal();
  if ( rc ) {
    double const*const* this_m = ThisM();
    for ( i = 0; i < m_row_count; i++ ) {
      d = 0.0;
      for ( j = 0; j < m_col_count; j++ ) {
        d += this_m[i][j]*this_m[i][j];
      }
      if ( fabs(1.0-d) >=  ON_SQRT_EPSILON )
        rc = false;
    }
  }
  return rc;
}